

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_texshader.cpp
# Opt level: O0

void __thiscall FShaderLayer::Update(FShaderLayer *this,float diff)

{
  float fVar1;
  float diff_local;
  FShaderLayer *this_local;
  
  FCycler::Update(&this->r,diff);
  FCycler::Update(&this->g,diff);
  FCycler::Update(&this->b,diff);
  FCycler::Update(&this->alpha,diff);
  FCycler::Update(&this->vectorY,diff);
  FCycler::Update(&this->vectorX,diff);
  FCycler::Update(&this->scaleX,diff);
  FCycler::Update(&this->scaleY,diff);
  FCycler::Update(&this->adjustX,diff);
  FCycler::Update(&this->adjustY,diff);
  FCycler::Update(&this->srcFactor,diff);
  FCycler::Update(&this->dstFactor,diff);
  fVar1 = FCycler::operator_cast_to_float(&this->vectorX);
  this->offsetX = fVar1 * diff + this->offsetX;
  if (1.0 <= this->offsetX) {
    this->offsetX = this->offsetX - 1.0;
  }
  if (this->offsetX <= 0.0 && this->offsetX != 0.0) {
    this->offsetX = this->offsetX + 1.0;
  }
  fVar1 = FCycler::operator_cast_to_float(&this->vectorY);
  this->offsetY = fVar1 * diff + this->offsetY;
  if (1.0 <= this->offsetY) {
    this->offsetY = this->offsetY - 1.0;
  }
  if (this->offsetY <= 0.0 && this->offsetY != 0.0) {
    this->offsetY = this->offsetY + 1.0;
  }
  this->rotation = this->rotate * diff + this->rotation;
  if (360.0 < this->rotation) {
    this->rotation = this->rotation - 360.0;
  }
  if (this->rotation <= 0.0 && this->rotation != 0.0) {
    this->rotation = this->rotation + 360.0;
  }
  if (this->layerMask != (FShaderLayer *)0x0) {
    Update(this->layerMask,diff);
  }
  return;
}

Assistant:

void FShaderLayer::Update(float diff)
{
	r.Update(diff);
	g.Update(diff);
	b.Update(diff);
	alpha.Update(diff);
	vectorY.Update(diff);
	vectorX.Update(diff);
	scaleX.Update(diff);
	scaleY.Update(diff);
	adjustX.Update(diff);
	adjustY.Update(diff);
	srcFactor.Update(diff);
	dstFactor.Update(diff);

	offsetX += vectorX * diff;
	if (offsetX >= 1.f) offsetX -= 1.f;
	if (offsetX < 0.f) offsetX += 1.f;

	offsetY += vectorY * diff;
	if (offsetY >= 1.f) offsetY -= 1.f;
	if (offsetY < 0.f) offsetY += 1.f;

	rotation += rotate * diff;
	if (rotation > 360.f) rotation -= 360.f;
	if (rotation < 0.f) rotation += 360.f;

	if (layerMask != NULL) layerMask->Update(diff);
}